

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_lambda.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::ExpressionBinder::BindExpression
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,LambdaExpression *expr,
          idx_t depth,LogicalType *list_child_type,
          optional_ptr<duckdb::LogicalType_(*)(unsigned_long,_const_duckdb::LogicalType_&),_true>
          bind_lambda_function)

{
  optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true> *this_00;
  size_type *this_01;
  pointer pDVar1;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var2;
  _func_int **pp_Var3;
  _func_LogicalType_unsigned_long_LogicalType_ptr **pp_Var4;
  vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_> *this_02;
  vector<duckdb::DummyBinding,_true> *pvVar5;
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> *p_Var6;
  pointer pPVar7;
  ulong uVar8;
  ExpressionType local_309;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_308;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_300;
  ExpressionBinder *local_2f8;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_2f0;
  BindResult *local_2e8;
  idx_t local_2e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  column_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  column_aliases;
  vector<duckdb::LogicalType,_true> column_types;
  unsigned_long local_278;
  string local_270;
  optional_ptr<duckdb::LogicalType_(*)(unsigned_long,_const_duckdb::LogicalType_&),_true>
  bind_lambda_function_local;
  vector<duckdb::DummyBinding,_true> local_bindings;
  string table_alias;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_210;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1f8;
  string local_1e0;
  BindResult result;
  DummyBinding new_lambda_binding;
  
  local_2f8 = this;
  local_2e8 = __return_storage_ptr__;
  local_2e0 = depth;
  bind_lambda_function_local.ptr = bind_lambda_function.ptr;
  if (bind_lambda_function.ptr == (_func_LogicalType_unsigned_long_LogicalType_ptr **)0x0) {
    if ((expr->copied_expr).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl ==
        (ParsedExpression *)0x0) {
      pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(&expr->expr);
      (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[0xc])(&new_lambda_binding,pPVar7);
      pp_Var3 = new_lambda_binding.super_Binding._vptr_Binding;
      new_lambda_binding.super_Binding._vptr_Binding = (_func_int **)0x0;
      _Var2._M_head_impl =
           (expr->copied_expr).
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      (expr->copied_expr).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (ParsedExpression *)pp_Var3;
      if (_Var2._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
        if (new_lambda_binding.super_Binding._vptr_Binding != (_func_int **)0x0) {
          (**(code **)(*new_lambda_binding.super_Binding._vptr_Binding + 8))();
        }
      }
    }
    local_2f0._M_head_impl =
         (expr->lhs).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (expr->lhs).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    local_300._M_head_impl =
         (expr->expr).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (expr->expr).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    OperatorExpression::OperatorExpression
              ((OperatorExpression *)&new_lambda_binding,ARROW,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_2f0,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_300);
    if (local_300._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_300._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_300._M_head_impl = (ParsedExpression *)0x0;
    if (local_2f0._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_2f0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_2f0._M_head_impl = (ParsedExpression *)0x0;
    BindExpression(__return_storage_ptr__,local_2f8,(OperatorExpression *)&new_lambda_binding,
                   local_2e0);
    if ((__return_storage_ptr__->error).initialized == true) {
      this_01 = &new_lambda_binding.super_Binding.alias.schema._M_string_length;
      p_Var6 = (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                *)vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::get<true>((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                               *)this_01,0);
      ::std::
      __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>::
      operator=((__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 *)&expr->lhs,p_Var6);
      p_Var6 = (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                *)vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::get<true>((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                               *)this_01,1);
      ::std::
      __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>::
      operator=((__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 *)&expr->expr,p_Var6);
    }
    OperatorExpression::~OperatorExpression((OperatorExpression *)&new_lambda_binding);
  }
  else {
    column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    column_names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    column_names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    column_names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    column_aliases.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    column_aliases.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    column_aliases.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ExtractParameters(expr,&column_names,&column_aliases);
    for (uVar8 = 0;
        uVar8 < (ulong)((long)column_names.
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)column_names.
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar8 = uVar8 + 1) {
      pp_Var4 = optional_ptr<duckdb::LogicalType_(*)(unsigned_long,_const_duckdb::LogicalType_&),_true>
                ::operator*(&bind_lambda_function_local);
      (**pp_Var4)((LogicalType *)&new_lambda_binding,uVar8,list_child_type);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
      emplace_back<duckdb::LogicalType>
                (&column_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 (LogicalType *)&new_lambda_binding);
      LogicalType::~LogicalType((LogicalType *)&new_lambda_binding);
    }
    ::std::__cxx11::string::string((string *)&new_lambda_binding,", ",(allocator *)&result);
    StringUtil::Join(&table_alias,&column_aliases,(string *)&new_lambda_binding);
    ::std::__cxx11::string::~string((string *)&new_lambda_binding);
    if (0x20 < (ulong)((long)column_aliases.
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)column_aliases.
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       "(",&table_alias);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &new_lambda_binding,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       ")");
      ::std::__cxx11::string::operator=((string *)&table_alias,(string *)&new_lambda_binding);
      ::std::__cxx11::string::~string((string *)&new_lambda_binding);
      ::std::__cxx11::string::~string((string *)&result);
    }
    local_bindings.super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>.
    super__Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_bindings.super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>.
    super__Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_bindings.super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>.
    super__Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    this_00 = &local_2f8->lambda_bindings;
    if ((local_2f8->lambda_bindings).ptr == (vector<duckdb::DummyBinding,_true> *)0x0) {
      this_00->ptr = &local_bindings;
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&local_1f8,
               &column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
              );
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_210,
             &column_names.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
    ::std::__cxx11::string::string((string *)&local_1e0,(string *)&table_alias);
    DummyBinding::DummyBinding
              (&new_lambda_binding,(vector<duckdb::LogicalType,_true> *)&local_1f8,&local_210,
               &local_1e0);
    ::std::__cxx11::string::~string((string *)&local_1e0);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_210);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1f8);
    this_02 = &optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true>::operator->(this_00)->
               super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>;
    ::std::vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>::push_back
              (this_02,&new_lambda_binding);
    if ((expr->copied_expr).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (ParsedExpression *)0x0) {
      ::std::
      __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>::
      operator=((__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 *)&expr->expr,
                (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 *)&expr->copied_expr);
    }
    (*local_2f8->_vptr_ExpressionBinder[5])(&result,local_2f8,&expr->expr,local_2e0,0);
    pvVar5 = optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true>::operator->(this_00);
    pDVar1 = (pvVar5->super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>).
             super__Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>._M_impl
             .super__Vector_impl_data._M_finish;
    (pvVar5->super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>).
    super__Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>._M_impl.
    super__Vector_impl_data._M_finish = pDVar1 + -1;
    (**pDVar1[-1].super_Binding._vptr_Binding)();
    pvVar5 = optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true>::operator->(this_00);
    if ((pvVar5->super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>).
        super__Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (pvVar5->super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>).
        super__Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      this_00->ptr = (vector<duckdb::DummyBinding,_true> *)0x0;
    }
    if (result.error.initialized == true) {
      ::std::__cxx11::string::string
                ((string *)&local_270,anon_var_dwarf_4b71df5 + 9,(allocator *)&local_278);
      ErrorData::Throw(&result.error,&local_270);
    }
    local_309 = LAMBDA;
    local_278 = (long)column_names.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)column_names.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
    make_uniq<duckdb::BoundLambdaExpression,duckdb::ExpressionType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,unsigned_long>
              ((duckdb *)&local_270,&local_309,&LogicalType::LAMBDA,&result.expression,&local_278);
    local_308._M_head_impl = (Expression *)local_270._M_dataplus._M_p;
    __return_storage_ptr__ = local_2e8;
    local_270._M_dataplus._M_p = (pointer)0x0;
    BindResult::BindResult
              (local_2e8,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_308);
    if (local_308._M_head_impl != (Expression *)0x0) {
      (*((local_308._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_308._M_head_impl = (Expression *)0x0;
    if ((long *)local_270._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_270._M_dataplus._M_p + 8))();
    }
    BindResult::~BindResult(&result);
    DummyBinding::~DummyBinding(&new_lambda_binding);
    ::std::vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>::~vector
              (&local_bindings.
                super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>);
    ::std::__cxx11::string::~string((string *)&table_alias);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&column_aliases);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&column_names);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              (&column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
              );
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult ExpressionBinder::BindExpression(LambdaExpression &expr, idx_t depth, const LogicalType &list_child_type,
                                            optional_ptr<bind_lambda_function_t> bind_lambda_function) {

	if (!bind_lambda_function) {
		// This is not a lambda expression, but the JSON arrow operator.
		// Remember the original expression in case of a binding error.
		if (!expr.copied_expr) {
			expr.copied_expr = expr.expr->Copy();
		}
		OperatorExpression arrow_expr(ExpressionType::ARROW, std::move(expr.lhs), std::move(expr.expr));
		auto bind_result = BindExpression(arrow_expr, depth);

		// The arrow_expr now might contain bound nodes.
		// Restore the original expression.
		if (bind_result.HasError()) {
			D_ASSERT(arrow_expr.children.size() == 2);
			expr.lhs = std::move(arrow_expr.children[0]);
			expr.expr = std::move(arrow_expr.children[1]);
		}
		return bind_result;
	}

	// extract and verify lambda parameters to create dummy columns
	vector<LogicalType> column_types;
	vector<string> column_names;
	vector<string> column_aliases;
	ExtractParameters(expr, column_names, column_aliases);
	for (idx_t i = 0; i < column_names.size(); i++) {
		column_types.push_back((*bind_lambda_function)(i, list_child_type));
	}

	// base table alias
	auto table_alias = StringUtil::Join(column_aliases, ", ");
	if (column_aliases.size() > 1) {
		table_alias = "(" + table_alias + ")";
	}

	// create a lambda binding and push it to the lambda bindings vector
	vector<DummyBinding> local_bindings;
	if (!lambda_bindings) {
		lambda_bindings = &local_bindings;
	}
	DummyBinding new_lambda_binding(column_types, column_names, table_alias);
	lambda_bindings->push_back(new_lambda_binding);

	if (expr.copied_expr) {
		expr.expr = std::move(expr.copied_expr);
	}
	auto result = BindExpression(expr.expr, depth, false);
	lambda_bindings->pop_back();

	// successfully bound a subtree of nested lambdas, set this to nullptr in case other parts of the
	// query also contain lambdas
	if (lambda_bindings->empty()) {
		lambda_bindings = nullptr;
	}

	if (result.HasError()) {
		result.error.Throw();
	}

	return BindResult(make_uniq<BoundLambdaExpression>(ExpressionType::LAMBDA, LogicalType::LAMBDA,
	                                                   std::move(result.expression), column_names.size()));
}